

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  size_t sVar2;
  uv__io_cb p_Var3;
  long *plVar4;
  long lVar5;
  int *piVar6;
  uint *puVar7;
  cmsghdr *pcVar8;
  uint uVar9;
  int iVar10;
  uv__io_t *puVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uv_stream_t *stream;
  msghdr msg;
  int error;
  uv_buf_t local_1d0;
  uint local_1bc;
  cmsghdr *local_1b8;
  int local_1ac;
  uv_stream_t *local_1a8;
  ulong local_1a0;
  size_t local_198;
  ulong local_190;
  uint *local_188;
  msghdr local_180;
  cmsghdr local_148 [17];
  
  uVar14 = w[-3].fd;
  if ((0xe < uVar14) || ((0x5080U >> (uVar14 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4ea,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)w[-1].pending_queue & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4eb,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar5 = *(long *)&w[-1].pevents;
  if (lVar5 != 0) {
    local_180.msg_name = (void *)CONCAT44(local_180.msg_name._4_4_,4);
    if ((uVar14 != 7) && (uVar14 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x521,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar14 = w[1].pevents;
    if (uVar14 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x52d,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,local_148,(socklen_t *)&local_180);
      uVar14 = -(uint)local_148[0].cmsg_len;
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,uVar14);
    }
    else {
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,uVar14);
      w[1].pevents = 0;
    }
    if (uVar14 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    iVar10 = *(int *)(*(long *)&w[-3].pevents + 0x20);
    if (iVar10 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53a,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)(*(long *)&w[-3].pevents + 0x20) = iVar10 + -1;
    if (((int)uVar14 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      uVar14 = (uint)local_148[0].cmsg_len;
    }
    if (*(code **)(lVar5 + 0x40) != (code *)0x0) {
      (**(code **)(lVar5 + 0x40))(lVar5);
      uVar14 = (uint)local_148[0].cmsg_len;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar14) {
      return;
    }
    puVar11 = (uv__io_t *)w[1].cb;
    if (w + 1 != puVar11) {
      do {
        p_Var3 = puVar11->cb;
        *(uv__io_cb *)puVar11->pending_queue[0] = p_Var3;
        *(void **)(p_Var3 + 8) = puVar11->pending_queue[0];
        *(undefined4 *)((long)puVar11->watcher_queue + 0xc) = 0xffffff83;
        puVar11->cb = (uv__io_cb)(w[1].pending_queue + 1);
        plVar4 = (long *)w[1].watcher_queue[0];
        puVar11->pending_queue[0] = plVar4;
        *plVar4 = (long)puVar11;
        w[1].watcher_queue[0] = puVar11;
        puVar11 = (uv__io_t *)w[1].cb;
      } while (w + 1 != puVar11);
    }
    uv__write_callbacks(stream);
    return;
  }
  iVar10 = w->fd;
  if (iVar10 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4f2,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) == 0) goto LAB_00231a78;
  *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffbfe;
  uVar18 = 0;
  if (uVar14 == 7) {
    uVar18 = (ulong)(*(int *)&w[2].cb != 0);
  }
  local_188 = &w[1].events;
  uVar19 = uVar18;
  iVar10 = 0x20;
  local_1a8 = stream;
  do {
    if (((w[-1].watcher_queue[1] == (void *)0x0) || (((ulong)w[-1].pending_queue[0] & 0x1000) == 0))
       || (iVar10 == 0)) goto LAB_00231a70;
    if (w[-1].watcher_queue[0] == (void *)0x0) {
      __assert_fail("stream->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x44e,"void uv__read(uv_stream_t *)");
    }
    local_1d0 = uv_buf_init((char *)0x0,0);
    (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&local_1d0);
    if ((local_1d0.base == (char *)0x0) || (local_1d0.len == 0)) {
      uVar16 = 0xffffffffffffff97;
      goto LAB_002319d9;
    }
    if (w->fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x459,"void uv__read(uv_stream_t *)");
    }
    local_1ac = iVar10 + -1;
    if ((char)uVar19 == '\0') {
      while( true ) {
        lVar5 = read(w->fd,local_1d0.base,local_1d0.len);
        if (-1 < lVar5) break;
        piVar6 = __errno_location();
        iVar10 = *piVar6;
        if (iVar10 != 4) goto LAB_002319b0;
      }
    }
    else {
      local_180.msg_flags = 0;
      local_180.msg_iov = (iovec *)&local_1d0;
      local_180.msg_iovlen = 1;
      local_180.msg_name = (void *)0x0;
      local_180.msg_namelen = 0;
      local_180.msg_controllen = 0x110;
      local_180.msg_control = local_148;
      while (lVar5 = uv__recvmsg(w->fd,&local_180,0), lVar5 < 0) {
        piVar6 = __errno_location();
        iVar10 = *piVar6;
        if (iVar10 != 4) goto LAB_002319b0;
      }
    }
    if (lVar5 == 0) {
      uv__stream_eof(stream,&local_1d0);
      goto LAB_00231a70;
    }
    local_198 = local_1d0.len;
    pcVar8 = (cmsghdr *)local_180.msg_control;
    local_1bc = events;
    local_190 = uVar19;
    if ((cmsghdr *)local_180.msg_control != (cmsghdr *)0x0 &&
        (0xf < local_180.msg_controllen && (char)uVar18 == '\x01')) {
      do {
        local_1b8 = pcVar8;
        if (pcVar8->cmsg_type == 1) {
          uVar19 = 0xffffffff;
          uVar14 = 0;
          do {
            uVar12 = uVar14;
            uVar17 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar17;
            sVar2 = uVar19 * 4 + 0x10;
            uVar14 = uVar12 + 1;
          } while ((long)sVar2 < (long)pcVar8->cmsg_len);
          if (sVar2 != pcVar8->cmsg_len) {
            __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x41a,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
          }
          if (uVar17 != 0) {
            uVar15 = (ulong)uVar12;
            uVar13 = 0;
            local_1a0 = uVar15;
LAB_002317dd:
            uVar14 = *(uint *)((long)&pcVar8[1].cmsg_len + uVar13 * 4);
            puVar7 = local_188;
            if (*local_188 == 0xffffffff) goto LAB_00231867;
            puVar7 = *(uint **)&w[1].fd;
            if (puVar7 != (uint *)0x0) {
              uVar12 = *puVar7;
              uVar9 = puVar7[1];
              if (uVar12 == uVar9) {
                puVar7 = (uint *)uv__realloc(puVar7,(ulong)(uVar12 + 7) * 4 + 0xc);
                if (puVar7 == (uint *)0x0) goto LAB_00231a39;
                *puVar7 = uVar12 + 8;
                *(uint **)&w[1].fd = puVar7;
                uVar9 = puVar7[1];
                uVar15 = local_1a0;
                pcVar8 = local_1b8;
              }
LAB_00231857:
              puVar7[1] = uVar9 + 1;
              puVar7 = puVar7 + (ulong)uVar9 + 2;
              goto LAB_00231867;
            }
            puVar7 = (uint *)uv__malloc(0x28);
            if (puVar7 != (uint *)0x0) {
              puVar7[0] = 8;
              puVar7[1] = 0;
              *(uint **)&w[1].fd = puVar7;
              uVar9 = 0;
              uVar15 = local_1a0;
              pcVar8 = local_1b8;
              goto LAB_00231857;
            }
LAB_00231a39:
            pcVar8 = local_1b8;
            if ((uint)uVar13 < uVar17) {
              do {
                uv__close(*(int *)((long)&pcVar8[1].cmsg_len + uVar13 * 4));
                uVar13 = uVar13 + 1;
              } while (uVar13 < uVar19);
            }
            stream = local_1a8;
            (*(code *)w[-1].watcher_queue[1])(local_1a8,0xfffffffffffffff4,&local_1d0);
            events = local_1bc;
            goto LAB_00231a70;
          }
        }
        else {
          fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
          pcVar8 = local_1b8;
        }
LAB_00231876:
        pcVar8 = __cmsg_nxthdr((msghdr *)&local_180,pcVar8);
        stream = local_1a8;
      } while (pcVar8 != (cmsghdr *)0x0);
    }
    (*(code *)w[-1].watcher_queue[1])(stream,lVar5,&local_1d0);
    uVar19 = local_190;
    iVar10 = local_1ac;
    events = local_1bc;
  } while ((long)local_198 <= lVar5);
  pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
  *pbVar1 = *pbVar1 | 4;
  goto LAB_00231a70;
LAB_00231867:
  *puVar7 = uVar14;
  uVar13 = uVar13 + 1;
  if (uVar15 == uVar13) goto LAB_00231876;
  goto LAB_002317dd;
LAB_002319b0:
  if (iVar10 == 0xb) {
    if ((*(uint *)w[-1].pending_queue >> 0xc & 1) != 0) {
      uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
    }
    uVar16 = 0;
LAB_002319d9:
    (*(code *)w[-1].watcher_queue[1])(stream,uVar16,&local_1d0);
  }
  else {
    *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffff3fff;
    (*(code *)w[-1].watcher_queue[1])(stream,-(long)*piVar6,&local_1d0);
    if ((*(uint *)w[-1].pending_queue >> 0xc & 1) != 0) {
      *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffefff;
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
      uVar14 = *(uint *)w[-1].pending_queue;
      if (((uVar14 & 4) != 0) &&
         (*(uint *)w[-1].pending_queue = uVar14 & 0xfffffffb, (uVar14 & 8) != 0)) {
        piVar6 = (int *)(*(long *)&w[-3].pevents + 8);
        *piVar6 = *piVar6 + -1;
      }
    }
  }
LAB_00231a70:
  iVar10 = w->fd;
  if (iVar10 == -1) {
    return;
  }
LAB_00231a78:
  if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x1c00) == 0x1400)) {
    local_148[0].cmsg_len = 0;
    local_148[0].cmsg_level = 0;
    local_148[0].cmsg_type = 0;
    uv__stream_eof(stream,(uv_buf_t *)local_148);
    iVar10 = w->fd;
  }
  if (((events & 0x1c) != 0) && (iVar10 != -1)) {
    uv__write(stream);
    uv__write_callbacks(stream);
    if (w + 1 == (uv__io_t *)w[1].cb) {
      uv__drain(stream);
    }
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}